

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O0

_Bool xdr_nrejected_reply(XDR *xdrs,rejected_reply *rr)

{
  _Bool _Var1;
  uint uVar2;
  bool_t bVar3;
  rejected_reply *rr_local;
  XDR *xdrs_local;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x6f,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
  }
  if (rr != (rejected_reply *)0x0) {
    uVar2 = xdr_enum((XDR *)xdrs,(enum_t *)rr);
    if ((uVar2 & 1) == 0) {
      xdrs_local._7_1_ = false;
    }
    else if (rr->rj_stat == RPC_MISMATCH) {
      _Var1 = xdr_u_int32_t(xdrs,&(rr->ru).RJ_why);
      if (_Var1) {
        xdrs_local._7_1_ = xdr_u_int32_t(xdrs,&(rr->ru).RJ_versions.high);
      }
      else {
        xdrs_local._7_1_ = false;
      }
    }
    else {
      if (rr->rj_stat != AUTH_ERROR) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                      ,0x80,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
      }
      bVar3 = xdr_enum((XDR *)xdrs,(enum_t *)&(rr->ru).RJ_why);
      xdrs_local._7_1_ = (_Bool)((byte)bVar3 & 1);
    }
    return xdrs_local._7_1_;
  }
  __assert_fail("rr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0x70,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
}

Assistant:

bool
xdr_nrejected_reply(XDR *xdrs, struct rejected_reply *rr)
{
	assert(xdrs != NULL);
	assert(rr != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_stat)))
		return (false);
	switch (rr->rj_stat) {

	case RPC_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.high)));

	case AUTH_ERROR:
		return (inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_why)));
	}
	/* NOTREACHED */
	assert(0);
	return (false);
}